

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O3

void __thiscall
llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::~BumpPtrAllocatorImpl
          (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  undefined1 *puVar4;
  
  uVar3 = (ulong)(this->Slabs).super_SmallVectorImpl<void_*>.
                 super_SmallVectorTemplateBase<void_*,_true>.
                 super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size;
  if (uVar3 != 0) {
    pvVar1 = (this->Slabs).super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>
             .super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
    lVar2 = 0;
    do {
      free(*(void **)((long)pvVar1 + lVar2));
      lVar2 = lVar2 + 8;
    } while (uVar3 << 3 != lVar2);
  }
  puVar4 = (undefined1 *)
           (this->CustomSizedSlabs).super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
           super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>.
           super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.
           super_SmallVectorBase.BeginX;
  uVar3 = (ulong)(this->CustomSizedSlabs).super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
                 super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>.
                 super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.
                 super_SmallVectorBase.Size;
  if (uVar3 != 0) {
    lVar2 = 0;
    do {
      free(*(void **)(puVar4 + lVar2));
      lVar2 = lVar2 + 0x10;
    } while (uVar3 << 4 != lVar2);
    puVar4 = (undefined1 *)
             (this->CustomSizedSlabs).super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
             super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>.
             super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.
             super_SmallVectorBase.BeginX;
  }
  if ((size_t *)puVar4 != &this->BytesAllocated) {
    free(puVar4);
  }
  puVar4 = (undefined1 *)
           (this->Slabs).super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>.
           super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
  if ((SmallVectorStorage<void_*,_4U> *)puVar4 !=
      &(this->Slabs).super_SmallVectorStorage<void_*,_4U>) {
    free(puVar4);
    return;
  }
  return;
}

Assistant:

~BumpPtrAllocatorImpl() {
    DeallocateSlabs(Slabs.begin(), Slabs.end());
    DeallocateCustomSizedSlabs();
  }